

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

Frame * __thiscall rw::Frame::cloneAndLink(Frame *this)

{
  Frame *this_00;
  Frame *newhier;
  Frame *this_local;
  
  this_00 = cloneRecurse(this,(Frame *)0x0);
  if (this_00 != (Frame *)0x0) {
    (this_00->object).privateFlags = (this_00->object).privateFlags & 0xfc;
    updateObjects(this_00);
  }
  return this_00;
}

Assistant:

Frame*
Frame::cloneAndLink(void)
{
	Frame *newhier = cloneRecurse(this, nil);
	if(newhier){
		// frame is not in dirty list so important to get this flag right
		newhier->object.privateFlags &= ~HIERARCHYSYNC;
		newhier->updateObjects();
	}
	return newhier;
}